

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

field<discordpp::EmbedProvider> * __thiscall
discordpp::field<discordpp::EmbedProvider>::operator=
          (field<discordpp::EmbedProvider> *this,field<discordpp::EmbedProvider> *f)

{
  _Head_base<0UL,_discordpp::EmbedProvider_*,_false> _Var1;
  EmbedProvider *this_00;
  
  _Var1._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedProvider_*,_std::default_delete<discordpp::EmbedProvider>_>
       .super__Head_base<0UL,_discordpp::EmbedProvider_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (EmbedProvider *)0x0) {
    this_00 = (pointer)0x0;
  }
  else {
    this_00 = (EmbedProvider *)operator_new(0x30);
    EmbedProvider::EmbedProvider(this_00,_Var1._M_head_impl);
  }
  std::__uniq_ptr_impl<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>::
  reset((__uniq_ptr_impl<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_> *
        )this,this_00);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }